

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_frame_core
          (dwarf_resolver *this,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  Dwarf_Addr pc;
  Dwarf_Half DVar1;
  anon_union_8_2_d41c7fdf_for_optional<const_cpptrace::detail::libdwarf::die_object_*,_0>_2 cu_die;
  source_location location;
  source_location location_00;
  char *in_stack_ffffffffffffff68;
  die_object local_90 [3];
  bool local_60;
  anon_union_32_2_d41c7fdf_for_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>_2
  local_58;
  bool local_38;
  
  pc = object_frame_info->object_address;
  lookup_cu((optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *)local_90,this,pc);
  if (local_60 == true) {
    cu_die.uvalue = local_90;
    if (((bool)local_90[1].dbg._0_1_ == false) &&
       (cu_die = (anon_union_8_2_d41c7fdf_for_optional<const_cpptrace::detail::libdwarf::die_object_*,_0>_2
                  )local_90[1].die, (bool)local_90[2].dbg._0_1_ == false)) {
      location._8_8_ = "Mal-formed maybe_owned_die_object";
      location.file = (char *)0x20f;
      assert_fail((detail *)0x0,0x1d26a7,
                  "const die_object &cpptrace::detail::libdwarf::maybe_owned_die_object::get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,location,in_stack_ffffffffffffff68);
    }
    get_dwo_name_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                *)&local_58,this,cu_die.uvalue);
    DVar1 = die_object::get_tag(cu_die.uvalue);
    if ((DVar1 == 0x4a) || ((local_38 == true && ((this->skeleton).holds_value == false)))) {
      perform_dwarf_fission_resolution
                (this,cu_die.uvalue,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  *)&local_58,object_frame_info,frame,inlines);
    }
    else {
      retrieve_line_info(this,cu_die.uvalue,pc,frame);
      if (local_60 == false) {
        location_00._8_8_ = "Optional does not contain a value";
        location_00.file = (char *)0x12b;
        assert_fail((detail *)0x0,0x1d1b94,
                    "T &cpptrace::detail::optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info>::unwrap() & [T = cpptrace::detail::libdwarf::dwarf_resolver::cu_info]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/utils/utils.hpp"
                    ,location_00,in_stack_ffffffffffffff68);
      }
      retrieve_symbol(this,cu_die.uvalue,pc,local_90[2].die._0_2_,frame,inlines);
    }
    if ((local_38 == true) &&
       (local_58.uvalue._M_dataplus._M_p != (_Alloc_hider)((long)&local_58.uvalue + 0x10))) {
      operator_delete((void *)local_58.uvalue._M_dataplus._M_p,local_58._16_8_ + 1);
    }
  }
  if (((local_60 & 1U) != 0) && (local_90[2].dbg._0_1_ = false, (bool)local_90[1].dbg._0_1_ == true)
     ) {
    die_object::~die_object(local_90);
  }
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void resolve_frame_core(
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            auto pc = object_frame_info.object_address;
            if(dump_dwarf) {
                std::fprintf(stderr, "%s\n", object_path.c_str());
                std::fprintf(stderr, "%llx\n", to_ull(pc));
            }
            optional<cu_info> cu = lookup_cu(pc);
            if(cu) {
                const auto& cu_die = cu.unwrap().cu_die.get();
                // gnu non-standard debug-fission may create non-skeleton CU DIEs and just add dwo attributes
                // clang emits dwo names in the split CUs, so guard against going down the dwarf fission path (which
                // doesn't infinitely recurse because it's not emitted as an absolute path and there's no comp dir but
                // it's good to guard against the infinite recursion anyway)
                auto dwo_name = get_dwo_name(cu_die);
                if(cu_die.get_tag() == DW_TAG_skeleton_unit || (dwo_name && !skeleton)) {
                    perform_dwarf_fission_resolution(cu_die, dwo_name, object_frame_info, frame, inlines);
                } else {
                    retrieve_line_info(cu_die, pc, frame);
                    retrieve_symbol(cu_die, pc, cu.unwrap().dwversion, frame, inlines);
                }
            }
        }